

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

longlong __thiscall Graph::solve(Graph *this)

{
  int iVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  pointer piVar3;
  bool bVar4;
  undefined1 auVar5 [8];
  uint uVar6;
  long lVar7;
  longlong *__s;
  ulong uVar8;
  long lVar9;
  long lVar10;
  longlong lVar11;
  undefined8 uStack_60;
  longlong lStack_58;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> temp;
  
  uStack_60 = 0x102b42;
  ts((vector<int,_std::allocator<int>_> *)local_50,this);
  temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&lStack_58;
  lVar9 = -((ulong)(uint)this->size * 8 + 0xf & 0xfffffffffffffff0);
  __s = (longlong *)((long)&lStack_58 + lVar9);
  lVar10 = (long)this->size;
  if (0 < lVar10) {
    *(undefined8 *)((long)&uStack_60 + lVar9) = 0x102b7a;
    memset(__s,0,lVar10 * 8);
  }
  *(undefined8 *)((long)&uStack_60 + lVar10 * 8 + lVar9) = 1;
  auVar5 = local_50;
  uVar6 = (int)((ulong)((long)temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start - (long)local_50) >> 2) - 1;
  if (-1 < (int)uVar6) {
    pvVar2 = this->adjacencyVector;
    uVar8 = (ulong)uVar6;
    do {
      iVar1 = *(int *)((long)auVar5 + uVar8 * 4);
      piVar3 = pvVar2[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = (long)pvVar2[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar3;
      if (lVar9 != 0) {
        lVar9 = lVar9 >> 2;
        lVar11 = __s[iVar1];
        lVar10 = 0;
        do {
          lVar7 = (__s[piVar3[lVar10]] % 0x3b9aca07 + lVar11) % 0x3b9aca07;
          lVar11 = lVar7 + 0x3b9aca07;
          if (-1 < lVar7) {
            lVar11 = lVar7;
          }
          __s[iVar1] = lVar11;
          lVar10 = lVar10 + 1;
        } while (lVar9 + (ulong)(lVar9 == 0) != lVar10);
      }
      bVar4 = 0 < (long)uVar8;
      uVar8 = uVar8 - 1;
    } while (bVar4);
  }
  lVar11 = *__s;
  if (local_50 != (undefined1  [8])0x0) {
    piVar3 = temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
    piVar3[-2] = 0x102c62;
    piVar3[-1] = 0;
    operator_delete((void *)local_50);
  }
  return lVar11;
}

Assistant:

long long Graph::solve() {
    vector<int> temp = ts();
    long long result[this->size];
    for (int k = 0; k < this->size; ++k) {
        result[k]=0;
    }
    result[this->size-1] = 1;
    for (int i = temp.size() - 1; i >= 0; i--) {
        for (int j = 0; j < adjacencyVector[temp[i]].size(); j++) {
            result[temp[i]] += (result[adjacencyVector[temp[i]][j]]%1000000007);
            result[temp[i]]%=1000000007;
            if(result[temp[i]]<0){
                result[temp[i]]+=1000000007;
            }
        }
    }
    return result[0];
}